

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::Impl
          (Impl *this,string *dbname,string *fullpath,
          unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
          *kvStore,unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                   *indexStore)

{
  KeyValueStore *pKVar1;
  
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR__Impl_00138b20;
  std::__cxx11::string::string((string *)&this->m_name,(string *)dbname);
  std::__cxx11::string::string((string *)&this->m_fullpath,(string *)fullpath);
  pKVar1 = (kvStore->_M_t).
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  (kvStore->_M_t).
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)0x0;
  (this->m_keyValueStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = pKVar1;
  pKVar1 = (indexStore->_M_t).
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  (indexStore->_M_t).
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = (KeyValueStore *)0x0;
  (this->m_indexStore)._M_t.
  super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>.
  _M_t.
  super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
  .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl = pKVar1;
  return;
}

Assistant:

EmbeddedDatabase::Impl::Impl(std::string dbname, std::string fullpath,
     std::unique_ptr<KeyValueStore>& kvStore, std::unique_ptr<KeyValueStore>& indexStore)
  : m_name(dbname), m_fullpath(fullpath), m_keyValueStore(kvStore.release()), m_indexStore(indexStore.release())
{
  ;
}